

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinternalmimedata.cpp
# Opt level: O2

QStringList * QInternalMimeData::formatsHelper(QStringList *__return_storage_ptr__,QMimeData *data)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  int i;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).d = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = 0xaaaaaaaa;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = 0xaaaaaaaa;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = 0xaaaaaaaa;
  (**(code **)(*(long *)data + 0x68))();
  cVar1 = QtPrivate::QStringList_contains
                    ((QList_conflict1 *)__return_storage_ptr__,(QLatin1String *)0x16,0x5d28c4);
  if (cVar1 != '\0') {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    imageWriteMimeFormats();
    lVar3 = 0;
    for (puVar4 = (undefined1 *)0x0; puVar4 < (ulong)local_48.size; puVar4 = puVar4 + 1) {
      bVar2 = QListSpecialMethods<QString>::contains
                        ((QListSpecialMethods<QString> *)__return_storage_ptr__,
                         (QString *)((long)&((local_48.ptr)->d).d + lVar3),CaseSensitive);
      if (!bVar2) {
        QList<QString>::emplaceBack<QString_const&>
                  (__return_storage_ptr__,(QString *)((long)&((local_48.ptr)->d).d + lVar3));
      }
      lVar3 = lVar3 + 0x18;
    }
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QInternalMimeData::formatsHelper(const QMimeData *data)
{
    QStringList realFormats = data->formats();
    if (realFormats.contains("application/x-qt-image"_L1)) {
        // add all supported image formats
        QStringList imageFormats = imageWriteMimeFormats();
        for (int i = 0; i < imageFormats.size(); ++i) {
            if (!realFormats.contains(imageFormats.at(i)))
                realFormats.append(imageFormats.at(i));
        }
    }
    return realFormats;
}